

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O1

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_prepare_t *loop;
  uv_loop_t *loop_00;
  int iVar2;
  
  loop = (uv_prepare_t *)uv_default_loop();
  iVar2 = 0x3285d0;
  iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_handle,0);
  if (iVar1 == 0) {
    loop = (uv_prepare_t *)uv_default_loop();
    iVar2 = 0x3286d8;
    iVar1 = uv_prepare_init((uv_loop_t *)loop,&prepare_handle);
    if (iVar1 != 0) goto LAB_00162e18;
    loop = &prepare_handle;
    iVar2 = 0x162e36;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    if (iVar1 != 0) goto LAB_00162e1d;
    loop = (uv_prepare_t *)uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00162e22;
    if (close_cb_called != 2) goto LAB_00162e27;
    if (connect_cb_called == 1) {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      iVar2 = 0;
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (uv_prepare_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162e31;
    }
  }
  else {
    run_test_pipe_connect_on_prepare_cold_1();
LAB_00162e18:
    run_test_pipe_connect_on_prepare_cold_2();
LAB_00162e1d:
    run_test_pipe_connect_on_prepare_cold_3();
LAB_00162e22:
    run_test_pipe_connect_on_prepare_cold_4();
LAB_00162e27:
    run_test_pipe_connect_on_prepare_cold_5();
  }
  run_test_pipe_connect_on_prepare_cold_6();
LAB_00162e31:
  run_test_pipe_connect_on_prepare_cold_7();
  if (loop == &prepare_handle) {
    uv_pipe_connect(&conn_req,&pipe_handle,"/path/to/unix/socket/that/really/should/not/be/there",
                    connect_cb);
    return extraout_EAX;
  }
  prepare_cb_cold_1();
  if (iVar2 == -2) {
    connect_cb_called = connect_cb_called + 1;
    uv_close((uv_handle_t *)&prepare_handle,close_cb);
    uv_close((uv_handle_t *)&pipe_handle,close_cb);
    return extraout_EAX_00;
  }
  connect_cb_cold_1();
  if ((uv_loop_t *)loop != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_01;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 2);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}